

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O0

void __thiscall bandit::reporter::spec::it_failed(spec *this,string *desc,assertion_exception *ex)

{
  ostream *poVar1;
  string local_70 [48];
  string local_40 [32];
  assertion_exception *local_20;
  assertion_exception *ex_local;
  string *desc_local;
  spec *this_local;
  
  local_20 = ex;
  ex_local = (assertion_exception *)desc;
  desc_local = (string *)this;
  progress_base::it_failed((progress_base *)this,desc,ex);
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[5])();
  std::operator<<(poVar1,local_40);
  std::__cxx11::string::~string(local_40);
  std::operator<<((this->super_colored_base).stm_,"FAILED");
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])();
  std::operator<<(poVar1,local_70);
  std::__cxx11::string::~string(local_70);
  std::ostream::operator<<((this->super_colored_base).stm_,std::endl<char,std::char_traits<char>>);
  std::ostream::flush();
  return;
}

Assistant:

void it_failed(const std::string& desc, const detail::assertion_exception& ex) override {
        progress_base::it_failed(desc, ex);
        stm_ << colorizer_.bad();
        stm_ << "FAILED";
        stm_ << colorizer_.reset();
        stm_ << std::endl;
        stm_.flush();
      }